

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void exchange_particles(int nm1,int nm2)

{
  int iVar1;
  int send_left;
  int send_width;
  int *piVar2;
  size_type sVar3;
  pointer psVar4;
  int in_ESI;
  int in_EDI;
  int unaff_retaddr;
  vector<particle,_std::allocator<particle>_> *in_stack_00000008;
  int in_stack_00000010;
  int mod;
  int size;
  int size2;
  int size1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe4;
  int receive_width;
  int iVar5;
  
  if ((exchange_particles(int,int)::particle_numbers == '\0') &&
     (iVar1 = __cxa_guard_acquire(&exchange_particles(int,int)::particle_numbers), iVar1 != 0)) {
    memset(&exchange_particles::particle_numbers,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x147d35);
    __cxa_atexit(std::vector<int,_std::allocator<int>_>::~vector,
                 &exchange_particles::particle_numbers,&__dso_handle);
    __cxa_guard_release(&exchange_particles(int,int)::particle_numbers);
  }
  if ((exchange_particles(int,int)::particles == '\0') &&
     (iVar1 = __cxa_guard_acquire(&exchange_particles(int,int)::particles), iVar1 != 0)) {
    memset(&exchange_particles::particles,0,0x18);
    std::vector<particle,_std::allocator<particle>_>::vector
              ((vector<particle,_std::allocator<particle>_> *)0x147d94);
    __cxa_atexit(std::vector<particle,_std::allocator<particle>_>::~vector,
                 &exchange_particles::particles,&__dso_handle);
    __cxa_guard_release(&exchange_particles(int,int)::particles);
  }
  send_left = ny_global * nz_global * in_EDI;
  send_width = ny_global * nz_global * in_ESI;
  piVar2 = std::max<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
  iVar1 = *piVar2;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&exchange_particles::particle_numbers);
  if ((int)sVar3 < iVar1) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  for (receive_width = 0; receive_width < 2; receive_width = receive_width + 1) {
    iVar5 = iVar1;
    if (mpi_rank % 2 == receive_width) {
      if (0 < mpi_rank) {
        in_stack_ffffffffffffffd8 = in_ESI;
        in_stack_ffffffffffffffdc = in_EDI;
        std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)(mpi_rank + -1));
        exchange_particle_slices
                  (send_left,send_width,iVar5,receive_width,iVar1,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),unaff_retaddr,
                   in_stack_00000008,in_stack_00000010);
        in_stack_ffffffffffffffe4 = iVar1;
      }
    }
    else if (mpi_rank < n_sr + -1) {
      psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                         ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                          0x147f08);
      spatial_region::get_nx(psVar4);
      psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                         ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                          0x147f30);
      spatial_region::get_nx(psVar4);
      std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)mpi_rank);
      exchange_particle_slices
                (send_left,send_width,iVar1,receive_width,in_stack_ffffffffffffffe4,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),unaff_retaddr,
                 in_stack_00000008,in_stack_00000010);
      iVar5 = iVar1;
    }
    iVar1 = iVar5;
  }
  return;
}

Assistant:

void exchange_particles(const int nm1, const int nm2) {
    static vector<int> particle_numbers{};
    static vector<particle> particles{};

    const int size1 = ny_global * nz_global * nm1;
    const int size2 = ny_global * nz_global * nm2;
    const int size = max(size1, size2);

    if (static_cast<int>(particle_numbers.size()) < size) {
        particle_numbers.resize(size);
    }

    for (int mod=0; mod<2; mod++) {

        // first even processes send, while odd receive, then vice versa
        if (mpi_rank % 2 == mod) {
            if (mpi_rank > 0) {
                exchange_particle_slices(nm1, nm2, 0, nm1, mpi_rank - 1, particle_numbers, size, particles,
                        -nx_sr[mpi_rank - 1] + nx_ich);
            }
        } else {
            if (mpi_rank < n_sr-1) {
                exchange_particle_slices(psr->get_nx() - nm2 - nm1, nm1, psr->get_nx() - nm2, nm2, mpi_rank + 1,
                        particle_numbers, size, particles, nx_sr[mpi_rank] - nx_ich);
            }
        }
    }

}